

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unisetspan.cpp
# Opt level: O0

int32_t icu_63::getUTF8Length(UChar *s,int32_t length)

{
  UBool UVar1;
  int32_t local_24;
  UErrorCode local_20;
  int32_t length8;
  UErrorCode errorCode;
  int32_t length_local;
  UChar *s_local;
  
  local_20 = U_ZERO_ERROR;
  local_24 = 0;
  length8 = length;
  _errorCode = s;
  u_strToUTF8_63((char *)0x0,0,&local_24,s,length,&local_20);
  UVar1 = ::U_SUCCESS(local_20);
  if ((UVar1 == '\0') && (local_20 != U_BUFFER_OVERFLOW_ERROR)) {
    s_local._4_4_ = 0;
  }
  else {
    s_local._4_4_ = local_24;
  }
  return s_local._4_4_;
}

Assistant:

static int32_t
getUTF8Length(const UChar *s, int32_t length) {
    UErrorCode errorCode=U_ZERO_ERROR;
    int32_t length8=0;
    u_strToUTF8(NULL, 0, &length8, s, length, &errorCode);
    if(U_SUCCESS(errorCode) || errorCode==U_BUFFER_OVERFLOW_ERROR) {
        return length8;
    } else {
        // The string contains an unpaired surrogate.
        // Ignore this string.
        return 0;
    }
}